

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_window_is_any_hovered(nk_context *ctx)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  nk_window *pnVar5;
  nk_window *pnVar6;
  int iVar7;
  nk_window **ppnVar8;
  undefined8 uVar9;
  nk_rect rect;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x404c,"int nk_window_is_any_hovered(struct nk_context *)");
  }
  ppnVar8 = &ctx->begin;
  do {
    pnVar5 = *ppnVar8;
    if (pnVar5 == (nk_window *)0x0) {
      return 0;
    }
    uVar4 = pnVar5->flags;
    if ((uVar4 >> 0xd & 1) == 0) {
      if ((((pnVar5->popup).active != 0) &&
          (pnVar6 = (pnVar5->popup).win, pnVar6 != (nk_window *)0x0)) &&
         (iVar7 = nk_input_is_mouse_hovering_rect(&ctx->input,pnVar6->bounds), iVar7 != 0)) {
        return 1;
      }
      uVar2 = (pnVar5->bounds).x;
      uVar3 = (pnVar5->bounds).y;
      rect.y = (float)uVar3;
      rect.x = (float)uVar2;
      uVar9._0_4_ = (pnVar5->bounds).w;
      uVar9._4_4_ = (pnVar5->bounds).h;
      if ((short)uVar4 < 0) {
        fVar1 = (ctx->style).window.header.padding.y;
        uVar9 = CONCAT44(fVar1 + fVar1 + ((ctx->style).font)->height,(undefined4)uVar9);
      }
      rect.w = (float)(int)uVar9;
      rect.h = (float)(int)((ulong)uVar9 >> 0x20);
      iVar7 = nk_input_is_mouse_hovering_rect(&ctx->input,rect);
      if (iVar7 != 0) {
        return 1;
      }
    }
    ppnVar8 = &pnVar5->next;
  } while( true );
}

Assistant:

NK_API int
nk_window_is_any_hovered(struct nk_context *ctx)
{
    struct nk_window *iter;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    iter = ctx->begin;
    while (iter) {
        /* check if window is being hovered */
        if(!(iter->flags & NK_WINDOW_HIDDEN)) {
            /* check if window popup is being hovered */
            if (iter->popup.active && iter->popup.win && nk_input_is_mouse_hovering_rect(&ctx->input, iter->popup.win->bounds))
                return 1;

            if (iter->flags & NK_WINDOW_MINIMIZED) {
                struct nk_rect header = iter->bounds;
                header.h = ctx->style.font->height + 2 * ctx->style.window.header.padding.y;
                if (nk_input_is_mouse_hovering_rect(&ctx->input, header))
                    return 1;
            } else if (nk_input_is_mouse_hovering_rect(&ctx->input, iter->bounds)) {
                return 1;
            }
        }
        iter = iter->next;
    }
    return 0;
}